

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SegmentBase.hpp
# Opt level: O2

bool __thiscall
CppJieba::SegmentBase::cut
          (SegmentBase *this,string *str,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *res)

{
  bool bVar1;
  undefined1 uVar2;
  allocator local_59;
  Unicode unico;
  string local_38;
  int iVar3;
  
  if (this->_isInited != false) {
    unico.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    unico.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    unico.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Limonp::utf8ToUnicode(str,&unico);
    if (bVar1) {
      iVar3 = (*(this->super_ISegment)._vptr_ISegment[4])
                        (this,unico.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                         unico.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                         _M_impl.super__Vector_impl_data._M_finish,res);
      uVar2 = (undefined1)iVar3;
    }
    else {
      std::__cxx11::string::string((string *)&local_38,"str[%s] decode failed.",&local_59);
      Limonp::Logger::LoggingF(4,"SegmentBase.hpp",0x24,&local_38,(str->_M_dataplus)._M_p);
      std::__cxx11::string::~string((string *)&local_38);
      uVar2 = 0;
    }
    std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
              (&unico.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
    return (bool)uVar2;
  }
  __assert_fail("_getInitFlag()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/SegmentBase.hpp"
                ,0x1e,
                "virtual bool CppJieba::SegmentBase::cut(const string &, vector<string> &) const");
}

Assistant:

virtual bool cut(const string& str, vector<string>& res)const
            {
				assert(_getInitFlag());
                Unicode unico;
#ifdef NO_FILTER
                unico.clear();
                if(!TransCode::decode(str, unico))
                {
                    LogFatal("str[%s] decode failed.", str.c_str());
                    return false;
                }
                return cut(unico.begin(), unico.end(), res);
#else
                const char * const cstr = str.c_str();
                uint size = str.size();
                uint offset = 0;
                string subs;
                int ret;
                uint len;
                while(offset < size)
                {
                    const char * const nstr = cstr + offset;
                    uint nsize = size - offset;
                    if(-1 == (ret = filterAscii(nstr, nsize, len)) || 0 == len || len > nsize)
                    {
                        LogFatal("str[%s] illegal.", cstr);
                        return false;
                    }
                    subs.assign(nstr, len);
                    if(!ret)
                    {
                        res.push_back(subs);
                    }
                    else
                    {
                        unico.clear();
                        if(!TransCode::decode(subs, unico))
                        {
                            LogFatal("str[%s] decode failed.", subs.c_str());
                            return false;
                        }
                        cut(unico.begin(), unico.end(), res);
                    }
                    offset += len;
                }
                return true;
#endif
            }